

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CovergroupType::CovergroupType
          (CovergroupType *this,Compilation *compilation,string_view name,SourceLocation loc,
          CovergroupBodySymbol *body)

{
  CovergroupBodySymbol *body_local;
  Compilation *compilation_local;
  CovergroupType *this_local;
  SourceLocation loc_local;
  string_view name_local;
  
  Type::Type(&this->super_Type,CovergroupType,name,loc);
  Scope::Scope(&this->super_Scope,compilation,(Symbol *)this);
  nonstd::span_lite::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
  span<true,_0>(&this->arguments);
  nonstd::span_lite::span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>::
  span<true,_0>(&this->sampleArguments);
  this->body = body;
  std::optional<const_slang::ast::TimingControl_*>::optional(&this->event);
  return;
}

Assistant:

CovergroupType::CovergroupType(Compilation& compilation, string_view name, SourceLocation loc,
                               const CovergroupBodySymbol& body) :
    Type(SymbolKind::CovergroupType, name, loc),
    Scope(compilation, this), body(body) {
}